

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapEditor.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  long *plVar3;
  size_type *psVar4;
  char *__s;
  char *__end;
  string name;
  Mat src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  _InputArray local_c8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Mat local_90 [96];
  
  local_b0 = 0x384000004b0;
  cv::Mat::Mat(local_90,&local_b0,0x10);
  local_108.field_2._M_allocated_capacity = 0;
  local_108._M_dataplus._M_p._0_4_ = 0x3010000;
  local_a8 = 0;
  uStack_a0 = 0x384000004b0;
  local_128._M_dataplus._M_p = (pointer)0x4059000000000000;
  local_128._M_string_length = 0x4059000000000000;
  local_128.field_2._M_allocated_capacity = 0x4059000000000000;
  local_128.field_2._8_8_ = 0;
  local_108._M_string_length = (size_type)local_90;
  cv::rectangle();
  paVar1 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"disp","");
  cv::namedWindow((string *)&local_128,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"disp","");
  cv::setMouseCallback((string *)&local_128,on_mouse,(void *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"test","");
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,argv[1],(allocator<char> *)&local_c8);
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  while( true ) {
    while( true ) {
      mapDraw(&obsts,&obstacle,local_90);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"disp","");
      local_c8.sz.width = 0;
      local_c8.sz.height = 0;
      local_c8.flags = 0x1010000;
      local_c8.obj = local_90;
      cv::imshow((string *)&local_108,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      cVar2 = cv::waitKey(10);
      if (cVar2 != 'e') break;
      if (0x10 < (ulong)((long)obstacle.
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)obstacle.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        std::
        vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
        ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>&>
                  ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                    *)&obsts,&obstacle);
        if (obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish =
               obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        puts("One obstacle is added.");
      }
    }
    if (cVar2 == '\x1b') break;
    if (cVar2 == 's') {
      if (0x10 < (ulong)((long)obstacle.
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)obstacle.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        std::
        vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
        ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>&>
                  ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                    *)&obsts,&obstacle);
        if (obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish =
               obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
      }
      std::operator+(&local_108,"../maps/",&local_128);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_108);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_e8.field_2._M_allocated_capacity = *psVar4;
        local_e8.field_2._8_8_ = plVar3[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar4;
        local_e8._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_e8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      mapSave(&obsts,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      __s = "Map saved.";
LAB_00106bca:
      puts(__s);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      cv::Mat::~Mat(local_90);
      return 0;
    }
  }
  __s = "Exiting directly, map not saved.";
  goto LAB_00106bca;
}

Assistant:

int main(int argc, char** argv) {
    const cv::Rect rect(0, 0, 1200, 900);
    cv::Mat src(cv::Size(1200, 900), CV_8UC3);
    cv::rectangle(src, rect, cv::Scalar(100, 100, 100), -1);
    cv::namedWindow("disp", cv::WINDOW_AUTOSIZE);
    cv::setMouseCallback("disp", on_mouse, NULL);
    std::string name = "test";
    if (argc >= 2) {
        name = std::string(argv[1]);
    }
    while (true) {
        mapDraw(obsts, obstacle, src);
        cv::imshow("disp", src);
        char key = cv::waitKey(10);
        if (key == 27) {
            printf("Exiting directly, map not saved.\n");
            break;
        } else if (key == 'e') {
            if (obstacle.size() < 3) continue;
            obsts.emplace_back(obstacle);
            obstacle.clear();
            printf("One obstacle is added.\n");
        } else if (key == 's') {
            if (obstacle.size() >= 3) {
                obsts.emplace_back(obstacle);
                obstacle.clear();
            }
            mapSave(obsts, "../maps/" + name + ".txt");
            printf("Map saved.\n");
            break;
        }
    }
    return 0;
}